

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall player_t::DestroyPSprites(player_t *this)

{
  DPSprite *pDVar1;
  DPSprite *pDVar2;
  
  pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->psprites);
  (this->psprites).field_0.p = (DPSprite *)0x0;
  while (pDVar1 != (DPSprite *)0x0) {
    pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)&pDVar1->Next);
    (pDVar1->Next).field_0.p = (DPSprite *)0x0;
    (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    pDVar1 = pDVar2;
  }
  return;
}

Assistant:

void player_t::DestroyPSprites()
{
	DPSprite *pspr = psprites;
	psprites = nullptr;
	while (pspr)
	{
		DPSprite *next = pspr->Next;
		pspr->Next = nullptr;
		pspr->Destroy();
		pspr = next;
	}
}